

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O3

size_type fs_resolve(char *path,bool strict,bool expand_tilde,char *result,size_type buffer_size)

{
  size_t sVar1;
  size_type sVar2;
  string_view s;
  string_view path_00;
  string local_50;
  
  sVar1 = strlen(path);
  path_00._M_str = path;
  path_00._M_len = sVar1;
  fs_resolve_abi_cxx11_(&local_50,path_00,strict,expand_tilde);
  s._M_str = local_50._M_dataplus._M_p;
  s._M_len = local_50._M_string_length;
  sVar2 = fs_str2char(s,result,buffer_size);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return sVar2;
}

Assistant:

std::string::size_type fs_resolve(const char* path, const bool strict, const bool expand_tilde,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_resolve(path, strict, expand_tilde), result, buffer_size);
}